

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_util.hpp
# Opt level: O2

idx_t duckdb::EncodingUtil::DecodeSignedLEB128<short>(const_data_ptr_t source,short *result)

{
  byte bVar1;
  idx_t iVar2;
  ulong uVar3;
  uint uVar4;
  
  *result = 0;
  uVar4 = 0;
  iVar2 = 0;
  uVar3 = 0;
  do {
    bVar1 = source[iVar2];
    iVar2 = iVar2 + 1;
    uVar4 = uVar4 | (bVar1 & 0x7f) << ((byte)uVar3 & 0x1f);
    *result = (ushort)uVar4;
    uVar3 = uVar3 + 7;
  } while ((char)bVar1 < '\0');
  if (0x3f < bVar1 && uVar3 < 0x10) {
    *result = (ushort)uVar4 | (ushort)(-1 << ((byte)uVar3 & 0x1f));
  }
  return iVar2;
}

Assistant:

static idx_t DecodeSignedLEB128(const_data_ptr_t source, T &result) {
		static_assert(std::is_integral<T>::value, "Must be integral");
		static_assert(std::is_signed<T>::value, "Must be signed");
		static_assert(sizeof(T) <= sizeof(int64_t), "Must be int64_t or smaller");

		// This is used to avoid undefined behavior when shifting into the sign bit
		using unsigned_type = typename std::make_unsigned<T>::type;

		result = 0;
		idx_t shift = 0;
		idx_t offset = 0;

		uint8_t byte;
		do {
			byte = source[offset++];
			result |= static_cast<unsigned_type>(byte & 0x7F) << shift;
			shift += 7;
		} while (byte & 0x80);

		// Sign-extend if the most significant bit of the last byte is set
		if (shift < sizeof(T) * 8 && (byte & 0x40)) {
			result |= -(static_cast<unsigned_type>(1) << shift);
		}
		return offset;
	}